

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O2

void __thiscall cmCPackIFWInstaller::GeneratePackageFiles(cmCPackIFWInstaller *this)

{
  bool bVar1;
  cmValue cVar2;
  _Base_ptr p_Var3;
  string forcedOption;
  cmCPackIFWPackage package;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  string local_330;
  cmCPackIFWPackage local_310;
  
  if (((this->Packages)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     (bVar1 = cmCPackIFWGenerator::IsOnePackage((this->super_cmCPackIFWCommon).Generator), !bVar1))
  {
    for (p_Var3 = (this->Packages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->Packages)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      cmCPackIFWPackage::GeneratePackageFile(*(cmCPackIFWPackage **)(p_Var3 + 2));
    }
    return;
  }
  cmCPackIFWPackage::cmCPackIFWPackage(&local_310);
  local_310.super_cmCPackIFWCommon.Generator = (this->super_cmCPackIFWCommon).Generator;
  local_310.Installer = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"CPACK_IFW_PACKAGE_GROUP",(allocator<char> *)&local_350);
  cVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  if (cVar2.Value == (string *)0x0) {
    cmCPackIFWPackage::ConfigureFromOptions(&local_310);
  }
  else {
    cmCPackIFWPackage::ConfigureFromGroup(&local_310,cVar2.Value);
    cmsys::SystemTools::UpperCase(&local_330,cVar2.Value);
    std::operator+(&local_350,"CPACK_IFW_COMPONENT_GROUP_",&local_330);
    std::operator+(&local_370,&local_350,"_FORCED_INSTALLATION");
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_330);
    cVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_370);
    if (cVar2.Value == (string *)0x0) {
      std::__cxx11::string::assign((char *)&local_310.ForcedInstallation);
    }
    std::__cxx11::string::~string((string *)&local_370);
  }
  cmCPackIFWPackage::GeneratePackageFile(&local_310);
  cmCPackIFWPackage::~cmCPackIFWPackage(&local_310);
  return;
}

Assistant:

void cmCPackIFWInstaller::GeneratePackageFiles()
{
  if (this->Packages.empty() || this->Generator->IsOnePackage()) {
    // Generate default package
    cmCPackIFWPackage package;
    package.Generator = this->Generator;
    package.Installer = this;
    // Check package group
    if (cmValue option = this->GetOption("CPACK_IFW_PACKAGE_GROUP")) {
      package.ConfigureFromGroup(option);
      std::string forcedOption = "CPACK_IFW_COMPONENT_GROUP_" +
        cmsys::SystemTools::UpperCase(option) + "_FORCED_INSTALLATION";
      if (!this->GetOption(forcedOption)) {
        package.ForcedInstallation = "true";
      }
    } else {
      package.ConfigureFromOptions();
    }
    package.GeneratePackageFile();
    return;
  }

  // Generate packages meta information
  for (auto& p : this->Packages) {
    cmCPackIFWPackage* package = p.second;
    package->GeneratePackageFile();
  }
}